

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O2

Query * simplify_subqueries(Query *__return_storage_ptr__,Query *q)

{
  pointer pQVar1;
  uint32_t count;
  vector<Query,_std::allocator<Query>_> *pvVar2;
  QueryType *pQVar3;
  pointer q_00;
  vector<Query,_std::allocator<Query>_> newqueries;
  vector<Query,_std::allocator<Query>_> local_98;
  Query local_78;
  
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar2 = Query::as_queries(q);
  pQVar1 = (pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (q_00 = (pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_start; q_00 != pQVar1; q_00 = q_00 + 1) {
    q_optimize(&local_78,q_00);
    std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_98,&local_78);
    Query::~Query(&local_78);
  }
  pQVar3 = Query::get_type(q);
  if (*pQVar3 == MIN_OF) {
    count = Query::as_count(q);
    q_min_of(__return_storage_ptr__,count,&local_98);
  }
  else {
    pQVar3 = Query::get_type(q);
    Query::Query(&local_78,pQVar3,&local_98);
    Query::Query(__return_storage_ptr__,&local_78);
    Query::~Query(&local_78);
  }
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

Query simplify_subqueries(Query &&q) {
    // q_optimize ensures QueryType is not PRIMITIVE already
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        newqueries.emplace_back(q_optimize(std::move(query)));
    }
    if (q.get_type() == QueryType::MIN_OF) {
        return q_min_of(q.as_count(), std::move(newqueries));
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}